

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabelPrivate::ensureTextLayouted(QLabelPrivate *this)

{
  QTextDocument *pQVar1;
  QTextFormat *pQVar2;
  long in_FS_OFFSET;
  QRect QVar3;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x340 & 4) != 0) {
    ensureTextPopulated(this);
    if ((QWidgetTextControl *)this->control != (QWidgetTextControl *)0x0) {
      pQVar1 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = 0xffffffffffffffff;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      QTextDocument::defaultTextOption();
      local_50 = (undefined1 *)
                 CONCAT44(local_50._4_4_,
                          (uint)(((uint)this->align >> 0xc & 1) == 0) * 0x200 +
                          ((uint)local_50 & 0xffffe000 | this->align & 0x1ffU) + 0x200);
      QTextDocument::setDefaultTextOption((QTextOption *)pQVar1);
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      QTextDocument::rootFrame();
      QTextFrame::frameFormat((QTextFrame *)&local_38);
      QTextFrameFormat::setMargin(0.0);
      pQVar2 = (QTextFormat *)QTextDocument::rootFrame();
      QTextObject::setFormat(pQVar2);
      QVar3 = documentRect(this);
      QTextDocument::setTextWidth((double)((QVar3.x2.m_i.m_i - QVar3.x1.m_i) + 1));
      QTextFormat::~QTextFormat((QTextFormat *)&local_38);
      QTextOption::~QTextOption((QTextOption *)&local_50);
    }
    this->field_0x340 = this->field_0x340 & 0xfb;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::ensureTextLayouted() const
{
    if (!textLayoutDirty)
        return;
    ensureTextPopulated();
    if (control) {
        QTextDocument *doc = control->document();
        QTextOption opt = doc->defaultTextOption();

        opt.setAlignment(QFlag(this->align));

        if (this->align & Qt::TextWordWrap)
            opt.setWrapMode(QTextOption::WordWrap);
        else
            opt.setWrapMode(QTextOption::ManualWrap);

        doc->setDefaultTextOption(opt);

        QTextFrameFormat fmt = doc->rootFrame()->frameFormat();
        fmt.setMargin(0);
        doc->rootFrame()->setFrameFormat(fmt);
        doc->setTextWidth(documentRect().width());
    }
    textLayoutDirty = false;
}